

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O1

char * utrace_functionName_63(int32_t fnNumber)

{
  ulong uVar1;
  char **ppcVar2;
  
  if ((uint)fnNumber < 2) {
    uVar1 = (ulong)(uint)fnNumber;
    ppcVar2 = trFnName;
  }
  else {
    if ((fnNumber & 0xfffffff8U) == 0x1000) {
      ppcVar2 = trConvNames + (fnNumber - 0x1000);
      goto LAB_002da48c;
    }
    if (8 < fnNumber - 0x2000U) {
      return "[BOGUS Trace Function Number]";
    }
    uVar1 = (ulong)(fnNumber - 0x2000U);
    ppcVar2 = trCollNames;
  }
  ppcVar2 = ppcVar2 + uVar1;
LAB_002da48c:
  return *ppcVar2;
}

Assistant:

U_CAPI const char * U_EXPORT2
utrace_functionName(int32_t fnNumber) {
    if(UTRACE_FUNCTION_START <= fnNumber && fnNumber < UTRACE_FUNCTION_LIMIT) {
        return trFnName[fnNumber];
    } else if(UTRACE_CONVERSION_START <= fnNumber && fnNumber < UTRACE_CONVERSION_LIMIT) {
        return trConvNames[fnNumber - UTRACE_CONVERSION_START];
    } else if(UTRACE_COLLATION_START <= fnNumber && fnNumber < UTRACE_COLLATION_LIMIT){
        return trCollNames[fnNumber - UTRACE_COLLATION_START];
    } else {
        return "[BOGUS Trace Function Number]";
    }
}